

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_absolute_x_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_184d01::NopAbsoluteXFixture_nop_absx_Test::NopAbsoluteXFixture_nop_absx_Test
          (NopAbsoluteXFixture_nop_absx_Test *this)

{
  NopAbsoluteXFixture_nop_absx_Test *this_local;
  
  NopAbsoluteXFixture::NopAbsoluteXFixture(&this->super_NopAbsoluteXFixture);
  (this->super_NopAbsoluteXFixture).super_CpuTest.super_Test._vptr_Test =
       (_func_int **)&PTR__NopAbsoluteXFixture_nop_absx_Test_003f37a8;
  (this->super_NopAbsoluteXFixture).super_WithParamInterface<unsigned_char>._vptr_WithParamInterface
       = (_func_int **)&DAT_003f37e8;
  return;
}

Assistant:

TEST_P(NopAbsoluteXFixture, nop_absx) {
    stage_instruction(GetParam());
    expected.pc += 2;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0x12));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}